

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

int __thiscall cppurses::System::run(System *this)

{
  int iVar1;
  Widget *pWVar2;
  undefined1 auStack_50 [4];
  int exit_code;
  size_t local_48;
  Event local_30;
  System *local_18;
  System *this_local;
  
  local_18 = this;
  pWVar2 = head();
  if (pWVar2 == (Widget *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    if (initial_focus_ != (Widget *)0x0) {
      (*initial_focus_->_vptr_Widget[2])(initial_focus_,1,0);
      Focus::set_focus_to(initial_focus_);
      Focus_in_event::Focus_in_event((Focus_in_event *)&local_30,initial_focus_);
      send_event(&local_30);
      Focus_in_event::~Focus_in_event((Focus_in_event *)&local_30);
    }
    Terminal::initialize((Terminal *)terminal);
    pWVar2 = head();
    _auStack_50 = Terminal::width((Terminal *)terminal);
    local_48 = Terminal::height((Terminal *)terminal);
    post_event<cppurses::Resize_event,cppurses::Widget&,cppurses::Area>(pWVar2,(Area *)auStack_50);
    iVar1 = Event_loop::run((Event_loop *)user_input_loop_);
    Terminal::uninitialize((Terminal *)terminal);
    this_local._4_4_ = iVar1;
  }
  return this_local._4_4_;
}

Assistant:

int System::run()
{
    if (System::head() == nullptr)
        return -1;
    if (initial_focus_ != nullptr) {
        initial_focus_->enable(true, false);
        Focus::set_focus_to(*initial_focus_);
        System::send_event(Focus_in_event{*initial_focus_});
    }
    terminal.initialize();
    System::post_event<Resize_event>(*System::head(),
                                     Area{terminal.width(), terminal.height()});
    const auto exit_code = user_input_loop_.run();
    terminal.uninitialize();
    return exit_code;
}